

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall UnifiedRegex::CharSet<char16_t>::Print(CharSet<char16_t> *this,DebugWriter *w)

{
  size_t sVar1;
  uint uVar2;
  bool bVar3;
  Char c;
  int iVar4;
  uint i;
  uint k;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  
  DebugWriter::Print(w,L"[");
  uVar5 = 0xffffffff;
  k = 0;
  do {
    sVar1 = (this->rep).compact.countPlusOne;
    c = (Char)k;
    uVar2 = uVar5;
    if (sVar1 - 1 < 5) {
      auVar7._0_4_ = -(uint)(k == (this->rep).compact.cs[0]);
      auVar7._4_4_ = -(uint)(k == (this->rep).compact.cs[1]);
      auVar7._8_4_ = -(uint)(k == (this->rep).compact.cs[2]);
      auVar7._12_4_ = -(uint)(k == (this->rep).compact.cs[3]);
      iVar4 = movmskps((int)sVar1,auVar7);
      if (iVar4 == 0) goto LAB_00e5cd3d;
LAB_00e5cd2d:
      uVar6 = k;
      if ((int)uVar5 < 0) {
LAB_00e5cd75:
        DebugWriter::PrintEscapedChar(w,c);
        uVar2 = uVar6;
      }
    }
    else {
      if (0xff < k) {
        if ((sVar1 == 0) || (bVar3 = Get_helper(this,k), !bVar3)) goto LAB_00e5cd3d;
        goto LAB_00e5cd2d;
      }
      if ((*(uint *)((long)&this->rep + (ulong)(k >> 5) * 4 + 8) >> (k & 0x1f) & 1) != 0)
      goto LAB_00e5cd2d;
LAB_00e5cd3d:
      if ((-1 < (int)uVar5) && (uVar2 = 0xffffffff, uVar5 + 1 < k)) {
        if (uVar5 + 2 < k) {
          DebugWriter::Print(w,L"-");
        }
        c = c + L'\xffff';
        uVar6 = 0xffffffff;
        goto LAB_00e5cd75;
      }
    }
    uVar5 = uVar2;
    k = k + 1;
    if (k == 0x10000) {
      if (-1 < (int)uVar5) {
        if (uVar5 < 0xfffe) {
          DebugWriter::Print(w,L"-");
        }
        DebugWriter::PrintEscapedChar(w,L'\xffff');
      }
      DebugWriter::Print(w,L"]");
      return;
    }
  } while( true );
}

Assistant:

void CharSet<char16>::Print(DebugWriter* w) const
    {
        w->Print(_u("["));
        int start = -1;
        for (uint i = 0; i < NumChars; i++)
        {
            if (Get(UTC(i)))
            {
                if (start < 0)
                {
                    start = i;
                    w->PrintEscapedChar(UTC(i));
                }
            }
            else
            {
                if (start >= 0)
                {
                    if (i > (uint)(start + 1))
                    {
                        if (i  > (uint)(start + 2))
                            w->Print(_u("-"));
                        w->PrintEscapedChar(UTC(i - 1));
                    }
                    start = -1;
                }
            }
        }
        if (start >= 0)
        {
            if ((uint)start < MaxUChar - 1)
                w->Print(_u("-"));
            w->PrintEscapedChar(MaxChar);
        }
        w->Print(_u("]"));
    }